

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamWriterPrivate::WriteReferences
          (BamWriterPrivate *this,RefVector *referenceSequences)

{
  pointer pRVar1;
  pointer pRVar2;
  uint uVar3;
  uint32_t maybeSwappedNameLen;
  uint32_t numReferenceSequences;
  int32_t referenceLength;
  
  numReferenceSequences =
       (uint32_t)
       (((long)(referenceSequences->
               super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>)._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(referenceSequences->
              super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>)._M_impl.
              super__Vector_impl_data._M_start) / 0x28);
  if (this->m_isBigEndian == true) {
    numReferenceSequences =
         numReferenceSequences >> 0x18 | (numReferenceSequences & 0xff0000) >> 8 |
         (numReferenceSequences & 0xff00) << 8 | numReferenceSequences << 0x18;
  }
  BgzfStream::Write(&this->m_stream,(char *)&numReferenceSequences,4);
  pRVar1 = (referenceSequences->
           super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar2 = (referenceSequences->
                super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>)._M_impl.
                super__Vector_impl_data._M_start; pRVar2 != pRVar1; pRVar2 = pRVar2 + 1) {
    uVar3 = (int)(pRVar2->RefName)._M_string_length + 1;
    maybeSwappedNameLen = uVar3;
    if (this->m_isBigEndian == true) {
      maybeSwappedNameLen =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 * 0x1000000;
    }
    BgzfStream::Write(&this->m_stream,(char *)&maybeSwappedNameLen,4);
    BgzfStream::Write(&this->m_stream,(pRVar2->RefName)._M_dataplus._M_p,(ulong)uVar3);
    referenceLength = pRVar2->RefLength;
    if (this->m_isBigEndian == true) {
      SwapEndian_32(&referenceLength);
    }
    BgzfStream::Write(&this->m_stream,(char *)&referenceLength,4);
  }
  return;
}

Assistant:

void BamWriterPrivate::WriteReferences(const BamTools::RefVector& referenceSequences)
{

    // write the number of reference sequences
    uint32_t numReferenceSequences = referenceSequences.size();
    if (m_isBigEndian) BamTools::SwapEndian_32(numReferenceSequences);
    m_stream.Write((char*)&numReferenceSequences, Constants::BAM_SIZEOF_INT);

    // foreach reference sequence
    RefVector::const_iterator rsIter = referenceSequences.begin();
    RefVector::const_iterator rsEnd = referenceSequences.end();
    for (; rsIter != rsEnd; ++rsIter) {

        // write the reference sequence name length (+1 for terminator)
        const uint32_t actualNameLen = rsIter->RefName.size() + 1;
        uint32_t maybeSwappedNameLen = actualNameLen;
        if (m_isBigEndian) BamTools::SwapEndian_32(maybeSwappedNameLen);
        m_stream.Write((char*)&maybeSwappedNameLen, Constants::BAM_SIZEOF_INT);

        // write the reference sequence name
        m_stream.Write(rsIter->RefName.c_str(), actualNameLen);

        // write the reference sequence length
        int32_t referenceLength = rsIter->RefLength;
        if (m_isBigEndian) BamTools::SwapEndian_32(referenceLength);
        m_stream.Write((char*)&referenceLength, Constants::BAM_SIZEOF_INT);
    }
}